

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qps.h
# Opt level: O0

void __thiscall qps::~qps(qps *this)

{
  undefined1 *in_RDI;
  
  *in_RDI = 1;
  std::thread::join();
  std::thread::~thread((thread *)0x1c02ff);
  return;
}

Assistant:

~qps() {
    stop_ = true;
    thd_.join();
  }